

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpdtrans.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CompoundTransliterator::joinIDs
          (UnicodeString *__return_storage_ptr__,CompoundTransliterator *this,
          Transliterator **transliterators,int32_t transCount)

{
  int iVar1;
  undefined4 extraout_var;
  int local_2c;
  int32_t i;
  int32_t transCount_local;
  Transliterator **transliterators_local;
  CompoundTransliterator *this_local;
  UnicodeString *id;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  for (local_2c = 0; local_2c < transCount; local_2c = local_2c + 1) {
    if (0 < local_2c) {
      icu_63::UnicodeString::append(__return_storage_ptr__,L';');
    }
    iVar1 = (*(transliterators[local_2c]->super_UObject)._vptr_UObject[0xd])();
    icu_63::UnicodeString::append
              (__return_storage_ptr__,(UnicodeString *)CONCAT44(extraout_var,iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CompoundTransliterator::joinIDs(Transliterator* const transliterators[],
                                              int32_t transCount) {
    UnicodeString id;
    for (int32_t i=0; i<transCount; ++i) {
        if (i > 0) {
            id.append(ID_DELIM);
        }
        id.append(transliterators[i]->getID());
    }
    return id; // Return temporary
}